

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::xml_document::_destroy(xml_document *this)

{
  xml_document *pxVar1;
  ulong uVar2;
  long lVar3;
  xml_node_struct *pxVar4;
  xml_node_struct **ppxVar5;
  
  pxVar4 = (this->super_xml_node)._root;
  if (pxVar4 == (xml_node_struct *)0x0) {
    __assert_fail("_root",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1bf3,"void pugi::xml_document::_destroy()");
  }
  if (this->_buffer != (char_t *)0x0) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              ();
    this->_buffer = (char_t *)0x0;
    pxVar4 = (this->super_xml_node)._root;
  }
  ppxVar5 = &pxVar4[1].parent;
  while (pxVar4 = *ppxVar5, pxVar4 != (xml_node_struct *)0x0) {
    if (pxVar4->header != 0) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )();
    }
    ppxVar5 = (xml_node_struct **)&pxVar4->name;
  }
  pxVar4 = (this->super_xml_node)._root;
  uVar2 = pxVar4->header >> 8;
  if (*(long *)((long)pxVar4 + (8 - uVar2)) == 0) {
    pxVar1 = (xml_document *)((long)pxVar4 - uVar2);
    if ((this->_memory <= pxVar1) && (pxVar1 < this + 1)) {
      lVar3 = *(long *)pxVar1->_memory;
      while (lVar3 != 0) {
        lVar3 = *(long *)(lVar3 + 0x10);
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)();
      }
      (this->super_xml_node)._root = (xml_node_struct *)0x0;
      return;
    }
    __assert_fail("reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1c05,"void pugi::xml_document::_destroy()");
  }
  __assert_fail("root_page && !root_page->prev",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0x1c04,"void pugi::xml_document::_destroy()");
}

Assistant:

PUGI__FN void xml_document::_destroy()
	{
		assert(_root);

		// destroy static storage
		if (_buffer)
		{
			impl::xml_memory::deallocate(_buffer);
			_buffer = 0;
		}

		// destroy extra buffers (note: no need to destroy linked list nodes, they're allocated using document allocator)
		for (impl::xml_extra_buffer* extra = static_cast<impl::xml_document_struct*>(_root)->extra_buffers; extra; extra = extra->next)
		{
			if (extra->buffer) impl::xml_memory::deallocate(extra->buffer);
		}

		// destroy dynamic storage, leave sentinel page (it's in static memory)
		impl::xml_memory_page* root_page = PUGI__GETPAGE(_root);
		assert(root_page && !root_page->prev);
		assert(reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory));

		for (impl::xml_memory_page* page = root_page->next; page; )
		{
			impl::xml_memory_page* next = page->next;

			impl::xml_allocator::deallocate_page(page);

			page = next;
		}

	#ifdef PUGIXML_COMPACT
		// destroy hash table
		static_cast<impl::xml_document_struct*>(_root)->hash.clear();
	#endif

		_root = 0;
	}